

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  undefined8 uVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiPtrOrIndex *pIVar7;
  float *__src;
  ImRect IVar8;
  uint uVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  ImU32 IVar12;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiPtrOrIndex *__dest;
  float *__dest_00;
  long lVar13;
  ImGuiTableColumn *pIVar14;
  char *__dest_01;
  int iVar15;
  int iVar16;
  uint uVar17;
  ImRect *pIVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  size_t size;
  ulong uVar22;
  ImGuiTableColumn *pIVar23;
  char *pcVar24;
  ImGuiContext *g;
  int iVar25;
  float fVar26;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar28 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ImVec2 IVar27;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar34 [64];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  ImRect outer_rect;
  ImRect local_b0;
  ulong local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  char *local_88;
  ImPool<ImGuiTable> *local_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined3 uStack_60;
  undefined5 uStack_5d;
  undefined3 uStack_58;
  undefined8 uStack_55;
  undefined8 uStack_4d;
  undefined8 uStack_45;
  undefined1 extraout_var [56];
  
  pIVar10 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  if (pIVar5->SkipItems == false) {
    uVar19 = (ulong)(uint)columns_count;
    if (0x3f < columns_count - 1U) {
      __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x133,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
      __assert_fail("inner_width >= 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x135,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    local_98 = inner_width;
    uStack_94 = in_XMM0_Db;
    uStack_90 = in_XMM0_Dc;
    uStack_8c = in_XMM0_Dd;
    auVar34._0_8_ = GetContentRegionAvail();
    auVar34._8_56_ = extraout_var;
    auVar29 = vmaxss_avx(auVar34._0_16_,ZEXT416(0x3f800000));
    if ((flags & 0x3000000U) == 0) {
      IVar27 = CalcItemSize(*outer_size,auVar29._0_4_,0.0);
      IVar3 = (pIVar5->DC).CursorPos;
      auVar38._8_8_ = 0;
      auVar38._0_4_ = IVar3.x;
      auVar38._4_4_ = IVar3.y;
      auVar29._0_4_ = IVar27.x + IVar3.x;
      auVar29._4_4_ = IVar27.y + IVar3.y;
      auVar29._8_4_ = (float)extraout_XMM0_Qb_00 + 0.0;
      auVar29._12_4_ = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20) + 0.0;
      local_b0 = (ImRect)vmovlhps_avx(auVar38,auVar29);
    }
    else {
      auVar38 = vmovshdup_avx(auVar34._0_16_);
      auVar38 = vmaxss_avx(auVar38,ZEXT416(0x3f800000));
      IVar27 = CalcItemSize(*outer_size,auVar29._0_4_,auVar38._0_4_);
      IVar3 = (pIVar5->DC).CursorPos;
      auVar36._8_8_ = 0;
      auVar36._0_4_ = IVar3.x;
      auVar36._4_4_ = IVar3.y;
      auVar28._0_4_ = IVar27.x + IVar3.x;
      auVar28._4_4_ = IVar27.y + IVar3.y;
      auVar28._8_4_ = (float)extraout_XMM0_Qb + 0.0;
      auVar28._12_4_ = (float)((ulong)extraout_XMM0_Qb >> 0x20) + 0.0;
      local_b0 = (ImRect)vmovlhps_avx(auVar36,auVar28);
      bVar11 = IsClippedEx(&local_b0,0,false);
      if (bVar11) {
        ItemSize(&local_b0,-1.0);
        goto LAB_00197d8a;
      }
    }
    local_80 = &pIVar10->Tables;
    local_88 = name;
    p_00 = ImPool<ImGuiTable>::GetOrAddByKey(local_80,id);
    iVar25 = pIVar10->FrameCount;
    iVar15 = 0;
    if (p_00->LastFrameActive == iVar25) {
      iVar15 = p_00->InstanceCurrent + 1;
    }
    uVar17 = p_00->Flags;
    auVar37._4_4_ = uStack_94;
    auVar37._0_4_ = local_98;
    auVar37._8_4_ = uStack_90;
    auVar37._12_4_ = uStack_8c;
    if ((0 < iVar15) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x148,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
    bVar11 = (flags & 0xe000U) == 0;
    p_00->IsDefaultSizingPolicy = bVar11;
    uVar20 = flags;
    if (bVar11) {
      uVar20 = 0x2000;
      if ((((uint)flags >> 0x18 & 1) == 0) && (uVar20 = 0x2000, (pIVar5->Flags & 0x40) == 0)) {
        uVar20 = 0x8000;
      }
      uVar20 = uVar20 | flags;
    }
    uVar21 = uVar20 | 0x40000;
    if ((uVar20 & 0xe000) != 0x4000) {
      uVar21 = uVar20;
    }
    uVar20 = uVar21 & 0xfffcffff;
    if ((uVar21 & 0x3000000) == 0) {
      uVar20 = uVar21;
    }
    uVar9 = uVar20 & 0xfffff7ff;
    if ((uVar20 >> 0xc & 1) == 0) {
      uVar9 = uVar20;
    }
    uVar20 = (uVar21 & 1) << 9 | uVar9;
    uVar21 = uVar20 | 0x10;
    if ((uVar9 & 0xf) == 0) {
      uVar20 = uVar21;
    }
    if (((uint)pIVar5->RootWindow->Flags >> 8 & 1) != 0) {
      uVar20 = uVar21;
    }
    p_00->ID = id;
    p_00->Flags = uVar20;
    p_00->InstanceCurrent = (ImS16)iVar15;
    p_00->LastFrameActive = iVar25;
    p_00->InnerWindow = pIVar5;
    p_00->OuterWindow = pIVar5;
    p_00->ColumnsCount = columns_count;
    p_00->IsLayoutLocked = false;
    p_00->InnerWidth = local_98;
    p_00->UserOuterSize = *outer_size;
    local_a0 = uVar19;
    if ((flags & 0x3000000U) == 0) {
      (p_00->InnerRect).Min = local_b0.Min;
      (p_00->InnerRect).Max = local_b0.Max;
      (p_00->OuterRect).Min = local_b0.Min;
      (p_00->OuterRect).Max = local_b0.Max;
      (p_00->WorkRect).Min = local_b0.Min;
      (p_00->WorkRect).Max = local_b0.Max;
    }
    else {
      uVar21 = uVar20 & 0x3000000;
      auVar29 = vcmpss_avx(ZEXT816(0) << 0x40,auVar37,1);
      if ((uVar20 & 0x1000000) == 0) {
        auVar37 = SUB6416(ZEXT464(0x7f7fffff),0);
      }
      auVar43._8_4_ = 0x7f7fffff;
      auVar43._0_8_ = 0x7f7fffff7f7fffff;
      auVar43._12_4_ = 0x7f7fffff;
      auVar29 = vblendvps_avx(auVar43,auVar37,auVar29);
      if (auVar29._0_4_ != 3.4028235e+38 || uVar21 == 0x1000000) {
        auVar38 = vcmpss_avx(auVar29,ZEXT416(0x7f7fffff),4);
        auVar38 = vpinsrb_avx(ZEXT416(auVar38._0_4_),
                              CONCAT31((int3)(uVar21 >> 8),uVar21 == 0x1000000),4);
        auVar38 = vpslld_avx(auVar38,0x1f);
        auVar29 = vblendps_avx(auVar29,_DAT_001f5fd0,0xe);
        auVar38 = vpsrad_avx(auVar38,0x1f);
        auVar29 = vpand_avx(auVar38,auVar29);
        local_78 = auVar29._0_8_;
        SetNextWindowContentSize(&local_78);
      }
      if ((uVar17 & 0x3000000) == 0) {
        local_78.x = 0.0;
        local_78.y = 0.0;
        SetNextWindowScroll(&local_78);
      }
      IVar8 = local_b0;
      auVar30._8_8_ = 0;
      auVar30._0_4_ = local_b0.Min.x;
      auVar30._4_4_ = local_b0.Min.y;
      local_b0.Max = IVar8.Max;
      auVar39._8_8_ = 0;
      auVar39._0_4_ = local_b0.Max.x;
      auVar39._4_4_ = local_b0.Max.y;
      auVar29 = vsubps_avx(auVar39,auVar30);
      local_78 = (ImVec2)vmovlps_avx(auVar29);
      local_b0 = IVar8;
      BeginChildEx(local_88,iVar15 + id,&local_78,false,(uVar20 & 0x1000000) >> 0xd);
      pIVar6 = pIVar10->CurrentWindow;
      p_00->InnerWindow = pIVar6;
      IVar3 = (pIVar6->WorkRect).Max;
      (p_00->WorkRect).Min = (pIVar6->WorkRect).Min;
      (p_00->WorkRect).Max = IVar3;
      IVar3 = pIVar6->Pos;
      auVar31._8_8_ = 0;
      auVar31._0_4_ = IVar3.x;
      auVar31._4_4_ = IVar3.y;
      auVar40._0_4_ = IVar3.x + (pIVar6->Size).x;
      auVar40._4_4_ = IVar3.y + (pIVar6->Size).y;
      auVar40._8_8_ = 0;
      IVar8 = (ImRect)vmovlhps_avx(auVar31,auVar40);
      p_00->OuterRect = IVar8;
      IVar3 = (pIVar6->InnerRect).Max;
      (p_00->InnerRect).Min = (pIVar6->InnerRect).Min;
      (p_00->InnerRect).Max = IVar3;
      fVar35 = (pIVar6->WindowPadding).x;
      if (((((fVar35 != 0.0) || (NAN(fVar35))) ||
           (fVar35 = (pIVar6->WindowPadding).y, fVar35 != 0.0)) ||
          ((NAN(fVar35) || (pIVar6->WindowBorderSize != 0.0)))) || (NAN(pIVar6->WindowBorderSize)))
      {
        __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x177,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
    PushOverrideID(iVar15 + id);
    pIVar6 = p_00->InnerWindow;
    p_00->HostIndentX = (pIVar6->DC).Indent.x;
    IVar3 = (pIVar6->ClipRect).Max;
    (p_00->HostClipRect).Min = (pIVar6->ClipRect).Min;
    (p_00->HostClipRect).Max = IVar3;
    p_00->HostSkipItems = pIVar6->SkipItems;
    IVar3 = (pIVar6->WorkRect).Max;
    (p_00->HostBackupWorkRect).Min = (pIVar6->WorkRect).Min;
    (p_00->HostBackupWorkRect).Max = IVar3;
    IVar3 = (pIVar6->ParentWorkRect).Max;
    (p_00->HostBackupParentWorkRect).Min = (pIVar6->ParentWorkRect).Min;
    (p_00->HostBackupParentWorkRect).Max = IVar3;
    (p_00->HostBackupColumnsOffset).x = (pIVar5->DC).ColumnsOffset.x;
    p_00->HostBackupPrevLineSize = (pIVar6->DC).PrevLineSize;
    p_00->HostBackupCurrLineSize = (pIVar6->DC).CurrLineSize;
    p_00->HostBackupCursorMaxPos = (pIVar6->DC).CursorMaxPos;
    p_00->HostBackupItemWidth = (pIVar5->DC).ItemWidth;
    p_00->HostBackupItemWidthStackSize = (pIVar5->DC).ItemWidthStack.Size;
    fVar35 = 0.0;
    fVar45 = 0.0;
    if ((uVar20 >> 9 & 1) != 0) {
      fVar45 = 1.0;
    }
    auVar32._0_12_ = ZEXT812(0);
    auVar32._12_4_ = 0;
    (pIVar6->DC).CurrLineSize.x = (float)(int)auVar32._0_8_;
    (pIVar6->DC).CurrLineSize.y = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
    (pIVar6->DC).PrevLineSize.x = (float)(int)auVar32._8_8_;
    (pIVar6->DC).PrevLineSize.y = (float)(int)((ulong)auVar32._8_8_ >> 0x20);
    if ((uVar20 & 0x800200) == 0) {
      fVar35 = (pIVar10->Style).CellPadding.x;
    }
    fVar26 = 0.0;
    fVar42 = 0.0;
    if ((uVar20 & 0x800200) == 0x200) {
      fVar42 = (pIVar10->Style).CellPadding.x;
    }
    p_00->CellSpacingX1 = fVar45 + fVar35;
    p_00->CellSpacingX2 = fVar35;
    p_00->CellPaddingX = fVar42;
    p_00->CellPaddingY = (pIVar10->Style).CellPadding.y;
    fVar35 = 0.0;
    if ((uVar20 >> 10 & 1) != 0) {
      fVar35 = 1.0;
    }
    if ((uVar20 >> 0x16 & 1) == 0 && (uVar20 & 0x200400) != 0) {
      fVar26 = (pIVar10->Style).CellPadding.x;
    }
    p_00->OuterPaddingX = (fVar35 + fVar26) - fVar42;
    p_00->CurrentRow = -1;
    p_00->CurrentColumn = -1;
    p_00->RowBgColorCounter = 0;
    *(uint *)&p_00->field_0x90 = (uint)*(ushort *)&p_00->field_0x90;
    pIVar18 = &pIVar6->ClipRect;
    if (pIVar6 == pIVar5) {
      pIVar18 = &p_00->WorkRect;
    }
    IVar3 = pIVar18->Max;
    (p_00->InnerClipRect).Min = pIVar18->Min;
    (p_00->InnerClipRect).Max = IVar3;
    auVar33._8_8_ = 0;
    auVar33._0_4_ = (p_00->InnerClipRect).Min.x;
    auVar33._4_4_ = (p_00->InnerClipRect).Min.y;
    auVar41._8_8_ = 0;
    auVar41._0_4_ = (p_00->InnerClipRect).Max.x;
    auVar41._4_4_ = (p_00->InnerClipRect).Max.y;
    auVar44._8_8_ = 0;
    auVar44._0_4_ = (p_00->WorkRect).Min.x;
    auVar44._4_4_ = (p_00->WorkRect).Min.y;
    auVar46._8_8_ = 0;
    auVar46._0_4_ = (p_00->WorkRect).Max.x;
    auVar46._4_4_ = (p_00->WorkRect).Max.y;
    auVar38 = vminps_avx(auVar41,auVar46);
    auVar29 = vcmpps_avx(auVar44,auVar33,2);
    auVar29 = vblendvps_avx(auVar44,auVar33,auVar29);
    IVar3 = (ImVec2)vmovlps_avx(auVar29);
    (p_00->InnerClipRect).Min = IVar3;
    IVar3 = (ImVec2)vmovlps_avx(auVar38);
    (p_00->InnerClipRect).Max = IVar3;
    ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
    if ((uVar20 >> 0x11 & 1) == 0) {
      fVar35 = (pIVar6->ClipRect).Max.y;
    }
    else {
      auVar29 = vminss_avx(ZEXT416((uint)(p_00->InnerClipRect).Max.y),
                           ZEXT416((uint)(pIVar6->WorkRect).Max.y));
      fVar35 = auVar29._0_4_;
    }
    (p_00->InnerClipRect).Max.y = fVar35;
    fVar35 = (p_00->WorkRect).Min.y;
    p_00->RowPosY2 = fVar35;
    p_00->RowPosY1 = fVar35;
    p_00->RowTextBaseline = 0.0;
    p_00->FreezeRowsRequest = '\0';
    p_00->FreezeRowsCount = '\0';
    p_00->FreezeColumnsRequest = '\0';
    p_00->FreezeColumnsCount = '\0';
    p_00->IsUnfrozenRows = true;
    p_00->DeclColumnsCount = '\0';
    IVar12 = GetColorU32(0x2b,1.0);
    p_00->BorderColorStrong = IVar12;
    IVar12 = GetColorU32(0x2c,1.0);
    p_00->BorderColorLight = IVar12;
    uVar21 = ImPool<ImGuiTable>::GetIndex(local_80,p_00);
    iVar25 = (pIVar10->CurrentTableStack).Size;
    iVar15 = (pIVar10->CurrentTableStack).Capacity;
    if (iVar25 == iVar15) {
      iVar25 = iVar25 + 1;
      if (iVar15 == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = iVar15 / 2 + iVar15;
      }
      if (iVar25 < iVar16) {
        iVar25 = iVar16;
      }
      if (iVar15 < iVar25) {
        __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar25 << 4);
        pIVar7 = (pIVar10->CurrentTableStack).Data;
        if (pIVar7 != (ImGuiPtrOrIndex *)0x0) {
          local_98 = SUB84(__dest,0);
          uStack_94 = (undefined4)((ulong)__dest >> 0x20);
          memcpy(__dest,pIVar7,(long)(pIVar10->CurrentTableStack).Size << 4);
          MemFree((pIVar10->CurrentTableStack).Data);
          __dest = (ImGuiPtrOrIndex *)CONCAT44(uStack_94,local_98);
        }
        (pIVar10->CurrentTableStack).Data = __dest;
        (pIVar10->CurrentTableStack).Capacity = iVar25;
      }
    }
    pIVar7 = (pIVar10->CurrentTableStack).Data;
    iVar25 = (pIVar10->CurrentTableStack).Size;
    pIVar7[iVar25].Ptr = (void *)0x0;
    pIVar7[iVar25].Index = uVar21;
    (pIVar10->CurrentTableStack).Size = (pIVar10->CurrentTableStack).Size + 1;
    pIVar10->CurrentTable = p_00;
    (pIVar5->DC).CurrentTableIdx = uVar21;
    if (pIVar6 != pIVar5) {
      (pIVar6->DC).CurrentTableIdx = uVar21;
    }
    if (((uVar17 & 2) != 0) && ((uVar20 & 2) == 0)) {
      p_00->IsResetDisplayOrderRequest = true;
    }
    if ((pIVar10->TablesLastTimeActive).Size <= (int)uVar21) {
      iVar25 = uVar21 + 1;
      iVar15 = (pIVar10->TablesLastTimeActive).Capacity;
      if (iVar15 <= (int)uVar21) {
        if (iVar15 == 0) {
          iVar16 = 8;
        }
        else {
          iVar16 = iVar15 / 2 + iVar15;
        }
        if (iVar16 <= iVar25) {
          iVar16 = iVar25;
        }
        if (iVar15 < iVar16) {
          __dest_00 = (float *)MemAlloc((long)iVar16 << 2);
          __src = (pIVar10->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            memcpy(__dest_00,__src,(long)(pIVar10->TablesLastTimeActive).Size << 2);
            MemFree((pIVar10->TablesLastTimeActive).Data);
          }
          (pIVar10->TablesLastTimeActive).Data = __dest_00;
          (pIVar10->TablesLastTimeActive).Capacity = iVar16;
        }
      }
      iVar15 = (pIVar10->TablesLastTimeActive).Size;
      lVar13 = (long)iVar15;
      if (iVar15 <= (int)uVar21) {
        do {
          (pIVar10->TablesLastTimeActive).Data[lVar13] = -1.0;
          lVar13 = lVar13 + 1;
        } while (iVar25 != lVar13);
      }
      (pIVar10->TablesLastTimeActive).Size = iVar25;
    }
    uVar19 = local_a0;
    if (((int)uVar21 < 0) || ((pIVar10->TablesLastTimeActive).Size <= (int)uVar21)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x66a,"T &ImVector<float>::operator[](int) [T = float]");
    }
    (pIVar10->TablesLastTimeActive).Data[uVar21] = (float)pIVar10->Time;
    p_00->MemoryCompacted = false;
    iVar25 = (int)((ulong)((long)(p_00->Columns).DataEnd - (long)(p_00->Columns).Data) >> 3) *
             -0x3b13b13b;
    iVar15 = (int)local_a0;
    if (iVar25 != iVar15 && iVar25 != 0) {
      MemFree(p_00->RawData);
      p_00->RawData = (void *)0x0;
    }
    if (p_00->RawData == (void *)0x0) {
      TableBeginInitMemory(p_00,iVar15);
      p_00->IsSettingsRequestLoad = true;
      p_00->IsInitializing = true;
    }
    if (p_00->IsResetAllRequest == true) {
      p_00->IsInitializing = true;
      p_00->IsResetAllRequest = false;
      p_00->IsSettingsRequestLoad = false;
      p_00->IsSettingsDirty = true;
      p_00->SettingsLoadedFlags = 0;
    }
    if (p_00->IsInitializing == true) {
      p_00->SettingsOffset = -1;
      p_00->IsSortSpecsDirty = true;
      p_00->InstanceInteracted = -1;
      p_00->ContextPopupColumn = -1;
      p_00->ReorderColumn = -1;
      p_00->HoveredColumnBody = -1;
      p_00->HoveredColumnBorder = -1;
      p_00->AutoFitSingleColumn = -1;
      p_00->ResizedColumn = -1;
      p_00->LastResizedColumn = -1;
      if (0 < iVar15) {
        lVar13 = 0x60;
        uVar22 = 0;
        do {
          pIVar14 = (p_00->Columns).Data;
          pIVar23 = (ImGuiTableColumn *)((long)pIVar14 + lVar13 + -0x60);
          if ((p_00->Columns).DataEnd <= pIVar23) goto LAB_00198819;
          uVar2 = *(undefined4 *)((long)pIVar14 + lVar13 + -0x4c);
          uStack_58 = 0;
          uStack_55 = 0;
          uStack_4d = 0;
          local_78.x = 0.0;
          local_78.y = 0.0;
          uStack_70 = 0;
          uStack_68 = 0;
          uStack_60 = 0;
          uStack_5d = 0;
          uStack_45 = 0xffffffffffffff00;
          pIVar23->Flags = 0;
          pIVar23->WidthGiven = 0.0;
          *(undefined8 *)((long)pIVar14 + lVar13 + -0x58) = 0;
          uVar4 = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
          *(undefined8 *)((long)pIVar14 + lVar13 + -0x50) = uVar4;
          *(undefined4 *)((long)pIVar14 + lVar13 + -0x48) = 0xbf800000;
          puVar1 = (undefined8 *)((long)pIVar14 + lVar13 + -0x44);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          puVar1 = (undefined8 *)((long)pIVar14 + lVar13 + -0x29);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0xffffffffffffff00;
          *(undefined2 *)((long)pIVar14 + lVar13 + -9) = 0xffff;
          *(undefined1 *)((long)pIVar14 + lVar13 + -7) = 0xff;
          *(undefined8 *)((long)pIVar14 + lVar13 + -6) = 0;
          *(undefined4 *)((long)&pIVar14->Flags + lVar13 + 2) = 0;
          *(undefined4 *)((long)pIVar14 + lVar13 + -0x4c) = uVar2;
          *(undefined1 *)((long)&pIVar14->Flags + lVar13) = 1;
          pcVar24 = (p_00->DisplayOrderToIndex).Data + uVar22;
          if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar24) {
            pcVar24 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
            goto LAB_00198845;
          }
          *pcVar24 = (char)uVar22;
          *(char *)((long)pIVar14 + lVar13 + -0xe) = (char)uVar22;
          *(undefined2 *)((long)pIVar14 + lVar13 + -6) = 0x101;
          uVar22 = uVar22 + 1;
          lVar13 = lVar13 + 0x68;
        } while ((uVar19 & 0xffffffff) != uVar22);
      }
    }
    if (p_00->IsSettingsRequestLoad == true) {
      TableLoadSettings(p_00);
    }
    fVar35 = pIVar10->FontSize;
    fVar45 = p_00->RefScale;
    if ((fVar45 != 0.0) || (NAN(fVar45))) {
      if (((fVar45 != fVar35) || (NAN(fVar45) || NAN(fVar35))) && (0 < iVar15)) {
        pIVar14 = (p_00->Columns).Data;
        uVar19 = uVar19 & 0xffffffff;
        do {
          if ((p_00->Columns).DataEnd <= pIVar14) {
LAB_00198819:
            pcVar24 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00198845:
            __assert_fail("p >= Data && p < DataEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                          ,0x216,pcVar24);
          }
          pIVar14->WidthRequest = (fVar35 / fVar45) * pIVar14->WidthRequest;
          pIVar14 = pIVar14 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
    }
    p_00->RefScale = fVar35;
    pIVar6->SkipItems = true;
    if (0 < (p_00->ColumnsNames).Buf.Size) {
      iVar25 = (p_00->ColumnsNames).Buf.Capacity;
      if (iVar25 < 0) {
        uVar17 = iVar25 / 2 + iVar25;
        size = 0;
        if (0 < (int)uVar17) {
          size = (size_t)uVar17;
        }
        __dest_01 = (char *)MemAlloc(size);
        pcVar24 = (p_00->ColumnsNames).Buf.Data;
        if (pcVar24 != (char *)0x0) {
          memcpy(__dest_01,pcVar24,(long)(p_00->ColumnsNames).Buf.Size);
          MemFree((p_00->ColumnsNames).Buf.Data);
        }
        (p_00->ColumnsNames).Buf.Data = __dest_01;
        (p_00->ColumnsNames).Buf.Capacity = (int)size;
      }
      (p_00->ColumnsNames).Buf.Size = 0;
    }
    TableBeginApplyRequests(p_00);
    bVar11 = true;
  }
  else {
LAB_00197d8a:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}